

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O2

int isoent_traverse_tree(archive_write *a,vdd *vdd)

{
  time_t *ptVar1;
  wchar_t wVar2;
  int iVar3;
  idrent *idrent;
  isoent **ppiVar4;
  archive_rb_node *self;
  isoent *piVar5;
  long lVar6;
  int iVar7;
  uint direction;
  char *pcVar8;
  char *pcVar9;
  isoent *piVar10;
  code *local_100;
  idr idr;
  
  ptVar1 = (time_t *)a->format_data;
  idr.idrent_pool = (idrent *)0x0;
  idr.pool_size = 0;
  if (vdd->vdd_type == VDD_JOLIET) {
    local_100 = isoent_gen_joliet_identifier;
  }
  else if ((*(byte *)((long)ptVar1 + 0x10372) & 1) == 0) {
    pcVar8 = "";
    pcVar9 = idr.char_map;
    for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
      *(undefined8 *)pcVar9 = *(undefined8 *)pcVar8;
      pcVar8 = pcVar8 + 8;
      pcVar9 = pcVar9 + 8;
    }
    local_100 = isoent_gen_iso9660_identifier;
  }
  else {
    pcVar8 = "";
    pcVar9 = idr.char_map;
    for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
      *(undefined8 *)pcVar9 = *(undefined8 *)pcVar8;
      pcVar8 = pcVar8 + 8;
      pcVar9 = pcVar9 + 8;
    }
    for (lVar6 = 0; lVar6 != 0xf; lVar6 = lVar6 + 1) {
      idr.char_map[lVar6 + 0x21] = '\x01';
    }
    for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
      idr.char_map[lVar6 + 0x3a] = '\x01';
    }
    for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
      idr.char_map[lVar6 + 0x5b] = '\x01';
    }
    idr.char_map[0x60] = '\x01';
    local_100 = isoent_gen_iso9660_identifier;
    for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
      idr.char_map[lVar6 + 0x7b] = '\x01';
    }
  }
  iVar7 = 0;
  piVar10 = vdd->rootent;
  do {
    if (((piVar10->field_0xe8 & 1) != 0) &&
       (wVar2 = archive_entry_mtime_is_set(piVar10->file->entry), wVar2 == L'\0')) {
      archive_entry_set_mtime(piVar10->file->entry,*ptVar1,0);
      archive_entry_set_atime(piVar10->file->entry,*ptVar1,0);
      archive_entry_set_ctime(piVar10->file->entry,*ptVar1,0);
    }
    if ((piVar10->children).first == (isoent *)0x0) {
LAB_004be03e:
      while ((piVar5 = piVar10, ppiVar4 = &piVar5->parent, iVar3 = iVar7, piVar5 != *ppiVar4 &&
             (piVar5 = piVar5->drnext, piVar5 == (isoent *)0x0))) {
        iVar7 = iVar7 + -1;
        piVar10 = *ppiVar4;
      }
    }
    else {
      if (((vdd->vdd_type != VDD_JOLIET) && ((*(ushort *)((long)ptVar1 + 0x10372) & 0x180) == 0)) &&
         (vdd->max_depth <= iVar7 + 1)) {
        if (0 < (piVar10->children).cnt) {
          ptVar1[0x5a] = (time_t)piVar10;
        }
        goto LAB_004be03e;
      }
      iVar3 = (*local_100)(a,piVar10,&idr);
      if (iVar3 < 0) goto LAB_004be08a;
      ppiVar4 = (isoent **)malloc((long)(piVar10->children).cnt << 3);
      if (ppiVar4 == (isoent **)0x0) {
        archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
        iVar3 = -0x1e;
        goto LAB_004be08a;
      }
      piVar10->children_sorted = ppiVar4;
      self = (archive_rb_node *)0x0;
      direction = 0;
      while (self = __archive_rb_tree_iterate(&idr.rbtree,self,direction),
            self != (archive_rb_node *)0x0) {
        *ppiVar4 = (isoent *)self[1].rb_info;
        ppiVar4 = ppiVar4 + 1;
        direction = 1;
      }
      piVar5 = (piVar10->subdirs).first;
      if ((piVar5 == (isoent *)0x0) || (iVar3 = iVar7 + 1, vdd->max_depth <= iVar7 + 1))
      goto LAB_004be03e;
    }
    iVar7 = iVar3;
    piVar10 = piVar5;
    if (piVar5 == piVar5->parent) {
      iVar3 = 0;
LAB_004be08a:
      free(idr.idrent_pool);
      return iVar3;
    }
  } while( true );
}

Assistant:

static int
isoent_traverse_tree(struct archive_write *a, struct vdd* vdd)
{
	struct iso9660 *iso9660 = a->format_data;
	struct isoent *np;
	struct idr idr;
	int depth;
	int r;
	int (*genid)(struct archive_write *, struct isoent *, struct idr *);

	idr_init(iso9660, vdd, &idr);
	np = vdd->rootent;
	depth = 0;
	if (vdd->vdd_type == VDD_JOLIET)
		genid = isoent_gen_joliet_identifier;
	else
		genid = isoent_gen_iso9660_identifier;
	do {
		if (np->virtual &&
		    !archive_entry_mtime_is_set(np->file->entry)) {
			/* Set properly times to virtual directory */
			archive_entry_set_mtime(np->file->entry,
			    iso9660->birth_time, 0);
			archive_entry_set_atime(np->file->entry,
			    iso9660->birth_time, 0);
			archive_entry_set_ctime(np->file->entry,
			    iso9660->birth_time, 0);
		}
		if (np->children.first != NULL) {
			if (vdd->vdd_type != VDD_JOLIET &&
			    !iso9660->opt.rr && depth + 1 >= vdd->max_depth) {
				if (np->children.cnt > 0)
					iso9660->directories_too_deep = np;
			} else {
				/* Generate Identifier */
				r = genid(a, np, &idr);
				if (r < 0)
					goto exit_traverse_tree;
				r = isoent_make_sorted_files(a, np, &idr);
				if (r < 0)
					goto exit_traverse_tree;

				if (np->subdirs.first != NULL &&
				    depth + 1 < vdd->max_depth) {
					/* Enter to sub directories. */
					np = np->subdirs.first;
					depth++;
					continue;
				}
			}
		}
		while (np != np->parent) {
			if (np->drnext == NULL) {
				/* Return to the parent directory. */
				np = np->parent;
				depth--;
			} else {
				np = np->drnext;
				break;
			}
		}
	} while (np != np->parent);

	r = ARCHIVE_OK;
exit_traverse_tree:
	idr_cleanup(&idr);

	return (r);
}